

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_generic.c
# Opt level: O2

void gf_25519_sub(gf_25519_s *d,gf_25519_s *a,gf_25519_s *b)

{
  ulong uVar1;
  uint i;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    d->limb[lVar2] = a->limb[lVar2] - b->limb[lVar2];
  }
  uVar3 = d->limb[0] + 0x1fffffffffffb4;
  d->limb[0] = uVar3;
  for (lVar2 = 1; lVar2 != 5; lVar2 = lVar2 + 1) {
    d->limb[lVar2] = d->limb[lVar2] + 0x1ffffffffffffc;
  }
  uVar1 = d->limb[4];
  for (uVar4 = 3; uVar4 != 0xffffffffffffffff; uVar4 = uVar4 - 1) {
    d->limb[uVar4 + 1] =
         (d->limb[uVar4 & 0xffffffff] >> 0x33) + (d->limb[uVar4 + 1] & 0x7ffffffffffff);
  }
  d->limb[0] = (uVar1 >> 0x33) * 0x13 + (uVar3 & 0x7ffffffffffff);
  return;
}

Assistant:

void gf_sub (gf d, const gf a, const gf b) {
    gf_sub_RAW ( d, a, b );
    gf_bias( d, 2 );
    gf_weak_reduce ( d );
}